

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O3

TidyMessageImpl *
tidyMessageCreateInitV
          (TidyDocImpl *doc,Node *node,uint code,int line,int column,TidyReportLevel level,
          __va_list_tag *args)

{
  printfArg *ppVar1;
  tidyStrings *ptVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  TidyReportLevel messageType;
  int iVar5;
  uint uVar6;
  Bool BVar7;
  Bool BVar8;
  TidyMessageImpl *pTVar9;
  byte *pbVar10;
  printfArg *ppVar11;
  ctmbstr ptVar12;
  tmbstr ptVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  anon_union_8_4_c3534ca5_for_u *paVar17;
  ulong uVar18;
  tidyStrings tVar19;
  ulong uVar20;
  char *pcVar21;
  byte *pbVar22;
  byte *pbVar23;
  long lVar24;
  char *format;
  TidyDoc tdoc;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  va_list args_copy;
  __va_list_tag local_68;
  uint local_50;
  uint local_4c;
  uint local_48;
  TidyReportLevel local_44;
  byte *local_40;
  long local_38;
  long lVar27;
  
  pTVar9 = (TidyMessageImpl *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x90);
  pTVar9->tidyDoc = doc;
  pTVar9->tidyNode = node;
  pTVar9->code = code;
  pTVar9->line = line;
  pTVar9->column = column;
  pTVar9->level = level;
  pTVar9->muted = no;
  ptVar2 = (doc->muted).list;
  if ((ptVar2 != (tidyStrings *)0x0) && (tVar19 = *ptVar2, tVar19 != 0)) {
    uVar15 = 1;
    do {
      if (tVar19 == code) {
        pTVar9->muted = yes;
        break;
      }
      tVar19 = ptVar2[uVar15];
      uVar15 = uVar15 + 1;
    } while (tVar19 != 0);
  }
  local_68.reg_save_area = args->reg_save_area;
  local_68.gp_offset = args->gp_offset;
  local_68.fp_offset = args->fp_offset;
  local_68.overflow_arg_area = args->overflow_arg_area;
  local_50 = column;
  local_44 = level;
  pbVar10 = (byte *)tidyDefaultString(code);
  pTVar9->argcount = 0;
  uVar15 = 0;
  pbVar23 = pbVar10;
LAB_0013a381:
  pbVar23 = pbVar23 + 1;
LAB_0013a384:
  pbVar22 = pbVar23;
  if (pbVar22[-1] != 0) goto code_r0x0013a38c;
  local_4c = line;
  if (uVar15 == 0) goto LAB_0013a713;
  uVar20 = (ulong)uVar15;
  local_48 = uVar15;
  local_40 = pbVar10;
  ppVar11 = (printfArg *)(*doc->allocator->vtbl->alloc)(doc->allocator,uVar20 * 0x30);
  auVar3 = _DAT_00181ec0;
  if (ppVar11 == (printfArg *)0x0) {
    pTVar9->argcount = -1;
    ppVar11 = (printfArg *)0x0;
    goto LAB_0013a716;
  }
  lVar24 = uVar20 - 1;
  auVar25._8_4_ = (int)lVar24;
  auVar25._0_8_ = lVar24;
  auVar25._12_4_ = (int)((ulong)lVar24 >> 0x20);
  lVar24 = 0;
  auVar25 = auVar25 ^ _DAT_00181ec0;
  auVar26 = _DAT_00181ea0;
  auVar28 = _DAT_00181eb0;
  do {
    auVar29 = auVar28 ^ auVar3;
    iVar5 = auVar25._4_4_;
    if ((bool)(~(auVar29._4_4_ == iVar5 && auVar25._0_4_ < auVar29._0_4_ || iVar5 < auVar29._4_4_) &
              1)) {
      pcVar21 = ppVar11->format + lVar24 + -0xc;
      pcVar21[0] = '\x14';
      pcVar21[1] = '\0';
      pcVar21[2] = '\0';
      pcVar21[3] = '\0';
    }
    if ((auVar29._12_4_ != auVar25._12_4_ || auVar29._8_4_ <= auVar25._8_4_) &&
        auVar29._12_4_ <= auVar25._12_4_) {
      pcVar21 = ppVar11[1].format + lVar24 + -0xc;
      pcVar21[0] = '\x14';
      pcVar21[1] = '\0';
      pcVar21[2] = '\0';
      pcVar21[3] = '\0';
    }
    auVar29 = auVar26 ^ auVar3;
    iVar16 = auVar29._4_4_;
    if (iVar16 <= iVar5 && (iVar16 != iVar5 || auVar29._0_4_ <= auVar25._0_4_)) {
      pcVar21 = ppVar11[2].format + lVar24 + -0xc;
      pcVar21[0] = '\x14';
      pcVar21[1] = '\0';
      pcVar21[2] = '\0';
      pcVar21[3] = '\0';
      pcVar21 = ppVar11[3].format + lVar24 + -0xc;
      pcVar21[0] = '\x14';
      pcVar21[1] = '\0';
      pcVar21[2] = '\0';
      pcVar21[3] = '\0';
    }
    lVar27 = auVar28._8_8_;
    auVar28._0_8_ = auVar28._0_8_ + 4;
    auVar28._8_8_ = lVar27 + 4;
    lVar27 = auVar26._8_8_;
    auVar26._0_8_ = auVar26._0_8_ + 4;
    auVar26._8_8_ = lVar27 + 4;
    lVar24 = lVar24 + 0xc0;
  } while ((uVar20 * 0x10 + 0x30 & 0xffffffffffffffc0) * 3 != lVar24);
  pbVar23 = local_40;
  lVar24 = -1;
  do {
    do {
      while (bVar14 = *pbVar23, bVar14 != 0x25) {
        pbVar23 = pbVar23 + 1;
        if (bVar14 == 0) {
          if (pTVar9->argcount < 0) goto LAB_0013a703;
          pTVar9->argcount = local_48;
          goto LAB_0013a716;
        }
      }
      bVar14 = pbVar23[1];
      pbVar10 = pbVar23 + 2;
      pbVar23 = pbVar10;
    } while (bVar14 == 0x25);
    if (bVar14 == 0x2a) break;
    while ((byte)(bVar14 - 0x30) < 10) {
      bVar14 = *pbVar23;
      pbVar23 = pbVar23 + 1;
    }
    if (bVar14 == 0x2e) {
      bVar14 = *pbVar23;
      if (bVar14 == 0x2a) break;
      while (pbVar23 = pbVar23 + 1, (byte)(bVar14 - 0x30) < 10) {
        bVar14 = *pbVar23;
      }
    }
    lVar24 = lVar24 + 1;
    ppVar1 = ppVar11 + lVar24;
    ppVar11[lVar24].type = tidyFormatType_UINT;
    switch(bVar14) {
    case 99:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_0013a5a0_caseD_63;
    case 100:
    case 0x69:
      ppVar1->type = tidyFormatType_INT;
      goto switchD_0013a5a0_caseD_63;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_0013a5a0_caseD_65:
      ppVar1->type = tidyFormatType_DOUBLE;
      uVar20 = (ulong)local_68.fp_offset;
      if (uVar20 < 0xa1) {
        local_68.fp_offset = local_68.fp_offset + 0x10;
        paVar17 = (anon_union_8_4_c3534ca5_for_u *)(uVar20 + (long)local_68.reg_save_area);
      }
      else {
        paVar17 = (anon_union_8_4_c3534ca5_for_u *)local_68.overflow_arg_area;
        local_68.overflow_arg_area =
             (anon_union_8_4_c3534ca5_for_u *)((long)local_68.overflow_arg_area + 8);
      }
      ppVar1->u = *paVar17;
      break;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_0013a5a0_caseD_68:
      ppVar1->type = tidyFormatType_UNKNOWN;
      pTVar9->argcount = -1;
      break;
    case 0x73:
      ppVar1->type = tidyFormatType_STRING;
      uVar20 = local_68._0_8_ & 0xffffffff;
      if (uVar20 < 0x29) {
        local_68.gp_offset = local_68.gp_offset + 8;
        paVar17 = (anon_union_8_4_c3534ca5_for_u *)(uVar20 + (long)local_68.reg_save_area);
      }
      else {
        paVar17 = (anon_union_8_4_c3534ca5_for_u *)local_68.overflow_arg_area;
        local_68.overflow_arg_area =
             (anon_union_8_4_c3534ca5_for_u *)((long)local_68.overflow_arg_area + 8);
      }
      ppVar1->u = *paVar17;
      break;
    default:
      if (bVar14 - 0x45 < 3) goto switchD_0013a5a0_caseD_65;
      if (bVar14 != 0x58) goto switchD_0013a5a0_caseD_68;
switchD_0013a5a0_caseD_63:
      uVar20 = local_68._0_8_ & 0xffffffff;
      if (uVar20 < 0x29) {
        local_68.gp_offset = local_68.gp_offset + 8;
        paVar17 = (anon_union_8_4_c3534ca5_for_u *)(uVar20 + (long)local_68.reg_save_area);
      }
      else {
        paVar17 = (anon_union_8_4_c3534ca5_for_u *)local_68.overflow_arg_area;
        local_68.overflow_arg_area =
             (anon_union_8_4_c3534ca5_for_u *)((long)local_68.overflow_arg_area + 8);
      }
      (ppVar1->u).i = paVar17->i;
    }
    iVar5 = ((int)pbVar10 - (int)local_40) + -2;
    ppVar1->formatStart = iVar5;
    iVar16 = (int)pbVar23 - (iVar5 + (int)local_40);
    ppVar1->formatLength = iVar16;
    if (0x14 < iVar16) break;
    local_38 = lVar24;
    strncpy(ppVar1->format,(char *)(local_40 + iVar5),(long)iVar16);
    ppVar1->format[iVar16] = '\0';
    lVar24 = local_38;
  } while (ppVar1->type != tidyFormatType_UNKNOWN);
  pTVar9->argcount = -1;
LAB_0013a703:
  (*doc->allocator->vtbl->free)(doc->allocator,ppVar11);
LAB_0013a713:
  ppVar11 = (printfArg *)0x0;
LAB_0013a716:
  pTVar9->arguments = ppVar11;
  ptVar12 = prvTidytidyErrorCodeAsKey(code);
  pTVar9->messageKey = ptVar12;
  ptVar12 = tidyDefaultString(code);
  pTVar9->messageFormatDefault = ptVar12;
  ptVar12 = tidyLocalizedString(code);
  pTVar9->messageFormat = ptVar12;
  ptVar13 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar9->messageDefault = ptVar13;
  local_68.gp_offset = args->gp_offset;
  local_68.fp_offset = args->fp_offset;
  local_68.overflow_arg_area = args->overflow_arg_area;
  local_68.reg_save_area = args->reg_save_area;
  prvTidytmbvsnprintf(pTVar9->messageDefault,0x800,pTVar9->messageFormatDefault,&local_68);
  ptVar13 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar9->message = ptVar13;
  local_68.gp_offset = args->gp_offset;
  local_68.fp_offset = args->fp_offset;
  local_68.overflow_arg_area = args->overflow_arg_area;
  local_68.reg_save_area = args->reg_save_area;
  prvTidytmbvsnprintf(pTVar9->message,0x800,pTVar9->messageFormat,&local_68);
  ptVar13 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar9->messagePosDefault = ptVar13;
  ptVar13 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  uVar4 = local_4c;
  uVar15 = local_50;
  pTVar9->messagePos = ptVar13;
  if ((*(int *)((doc->config).value + 0x13) == 0) ||
     (uVar18 = (doc->config).value[0x14].v, uVar18 == 0)) {
    if ((*(int *)((doc->config).value + 0x4a) != 0) && ((doc->config).value[0x14].v != 0)) {
      ptVar13 = pTVar9->messagePosDefault;
      ptVar12 = tidyDefaultString(0x1f6);
      uVar15 = local_50;
      prvTidytmbsnprintf(ptVar13,0x800,ptVar12,(doc->config).value[0x14].v,(ulong)uVar4,
                         (ulong)local_50);
      ptVar13 = pTVar9->messagePos;
      pcVar21 = tidyLocalizedString(0x1f6);
      uVar18 = (doc->config).value[0x14].v;
      goto LAB_0013a8ad;
    }
    ptVar13 = pTVar9->messagePosDefault;
    ptVar12 = tidyDefaultString(0x1f5);
    uVar15 = local_50;
    prvTidytmbsnprintf(ptVar13,0x800,ptVar12,(ulong)uVar4,(ulong)local_50);
    ptVar13 = pTVar9->messagePos;
    ptVar12 = tidyLocalizedString(0x1f5);
    prvTidytmbsnprintf(ptVar13,0x800,ptVar12,(ulong)uVar4,(ulong)uVar15);
  }
  else {
    prvTidytmbsnprintf(pTVar9->messagePosDefault,0x800,"%s:%d:%d: ",uVar18,(ulong)local_4c,
                       (ulong)local_50);
    ptVar13 = pTVar9->messagePos;
    uVar18 = (doc->config).value[0x14].v;
    pcVar21 = "%s:%d:%d: ";
LAB_0013a8ad:
    prvTidytmbsnprintf(ptVar13,0x800,pcVar21,uVar18,(ulong)uVar4,(ulong)uVar15);
  }
  messageType = local_44;
  ptVar12 = tidyDefaultString(local_44);
  pTVar9->messagePrefixDefault = ptVar12;
  ptVar12 = tidyLocalizedString(messageType);
  pTVar9->messagePrefix = ptVar12;
  pcVar21 = "%s%s%s";
  if ((int)uVar15 < 1) {
    pcVar21 = "%.0s%s%s";
  }
  if ((int)uVar4 < 1) {
    pcVar21 = "%.0s%s%s";
  }
  format = "%.0s%.0s%s";
  if (messageType < TidyDialogueSummary) {
    format = pcVar21;
  }
  ptVar13 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar9->messageOutputDefault = ptVar13;
  prvTidytmbsnprintf(ptVar13,0x800,format,pTVar9->messagePosDefault,pTVar9->messagePrefixDefault,
                     pTVar9->messageDefault);
  ptVar13 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar9->messageOutput = ptVar13;
  prvTidytmbsnprintf(ptVar13,0x800,format,pTVar9->messagePos,pTVar9->messagePrefix,pTVar9->message);
  if ((messageType < TidyDialogueSummary) && (*(int *)((doc->config).value + 0x37) == 1)) {
    ptVar12 = prvTidytidyErrorCodeAsKey(code);
    uVar6 = prvTidytmbstrlen(pTVar9->messageOutputDefault);
    if (uVar6 < 0x800) {
      prvTidytmbsnprintf(pTVar9->messageOutputDefault + uVar6,(ulong)(0x800 - uVar6)," (%s)",ptVar12
                        );
    }
    uVar6 = prvTidytmbstrlen(pTVar9->messageOutput);
    if (uVar6 < 0x800) {
      prvTidytmbsnprintf(pTVar9->messageOutput + uVar6,(ulong)(0x800 - uVar6)," (%s)",ptVar12);
    }
  }
  pTVar9->allowMessage = yes;
  if (pTVar9->level < TidyDialogueSummary) {
    if (doc->reportFilter != (TidyReportFilter)0x0) {
      BVar7 = (*doc->reportFilter)
                        ((TidyDoc)doc,pTVar9->level,pTVar9->line,pTVar9->column,
                         pTVar9->messageOutput);
      pTVar9->allowMessage = BVar7 & yes;
      if (TidyFatal < pTVar9->level) goto LAB_0013aacd;
    }
    if (doc->reportCallback != (TidyReportCallback)0x0) {
      local_68.reg_save_area = args->reg_save_area;
      local_68.gp_offset = args->gp_offset;
      local_68.fp_offset = args->fp_offset;
      local_68.overflow_arg_area = args->overflow_arg_area;
      BVar7 = pTVar9->allowMessage;
      BVar8 = (*doc->reportCallback)
                        ((TidyDoc)doc,pTVar9->level,pTVar9->line,pTVar9->column,pTVar9->messageKey,
                         &local_68);
      pTVar9->allowMessage = BVar8 & BVar7;
    }
  }
LAB_0013aacd:
  if (doc->messageCallback != (TidyMessageCallback)0x0) {
    BVar7 = pTVar9->allowMessage;
    BVar8 = (*doc->messageCallback)((TidyMessage)pTVar9);
    pTVar9->allowMessage = BVar8 & BVar7;
  }
  return pTVar9;
code_r0x0013a38c:
  pbVar23 = pbVar22 + 1;
  if (pbVar22[-1] == 0x25) goto code_r0x0013a394;
  goto LAB_0013a384;
code_r0x0013a394:
  uVar15 = uVar15 + (*pbVar22 != 0x25);
  goto LAB_0013a381;
}

Assistant:

static TidyMessageImpl *tidyMessageCreateInitV( TidyDocImpl *doc,
                                                Node *node,
                                                uint code,
                                                int line,
                                                int column,
                                                TidyReportLevel level,
                                                va_list args )
{
    TidyMessageImpl *result = TidyDocAlloc(doc, sizeof(TidyMessageImpl));
    TidyDoc tdoc = tidyImplToDoc(doc);
    va_list args_copy;
    enum { sizeMessageBuf=2048 };
    ctmbstr pattern;
    uint i = 0;


    /* Things we know... */

    result->tidyDoc = doc;
    result->tidyNode = node;
    result->code = code;
    result->line = line;
    result->column = column;
    result->level = level;
    /* Is #719 - set 'muted' before any callbacks. */
    result->muted = no;
    i = 0;
    while ((doc->muted.list) && (doc->muted.list[i] != 0))
    {
        if (doc->muted.list[i] == code)
        {
            result->muted = yes;
            break;
        }
        i++;
    }

    /* Things we create... */

    va_copy(args_copy, args);
    result->arguments = BuildArgArray(doc, tidyDefaultString(code), args_copy, &result->argcount);
    va_end(args_copy);

    result->messageKey = TY_(tidyErrorCodeAsKey)(code);

    result->messageFormatDefault = tidyDefaultString(code);
    result->messageFormat = tidyLocalizedString(code);

    result->messageDefault = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->messageDefault, sizeMessageBuf, result->messageFormatDefault, args_copy);
    va_end(args_copy);

    result->message = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->message, sizeMessageBuf, result->messageFormat, args_copy);
    va_end(args_copy);

    result->messagePosDefault = TidyDocAlloc(doc, sizeMessageBuf);
    result->messagePos = TidyDocAlloc(doc, sizeMessageBuf);

    if ( cfgBool(doc, TidyEmacs) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Change formatting to be parsable by GNU Emacs */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
    }
    else if ( cfgBool(doc, TidyShowFilename) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Include filename in output */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
    }
    else
    {
        /* traditional format */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(LINE_COLUMN_STRING), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(LINE_COLUMN_STRING), line, column);
    }

    result->messagePrefixDefault = tidyDefaultString(level);

    result->messagePrefix = tidyLocalizedString(level);

    if ( line > 0 && column > 0 )
        pattern = "%s%s%s";      /* pattern if there's location information */
    else
        pattern = "%.0s%s%s";    /* otherwise if there isn't */

    if ( level > TidyFatal )
        pattern = "%.0s%.0s%s";  /* dialog doesn't have pos or prefix */

    result->messageOutputDefault = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutputDefault, sizeMessageBuf, pattern,
                     result->messagePosDefault, result->messagePrefixDefault,
                     result->messageDefault);

    result->messageOutput = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutput, sizeMessageBuf, pattern,
                     result->messagePos, result->messagePrefix,
                     result->message);

    if ( ( cfgBool(doc, TidyMuteShow) == yes ) && level <= TidyFatal )
    {
        /*\ Issue #655 - Unsafe to use output buffer as one of the va_list
         *  input parameters in some snprintf implmentations.
        \*/
        ctmbstr pc = TY_(tidyErrorCodeAsKey)(code);
        i = TY_(tmbstrlen)(result->messageOutputDefault);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutputDefault + i, sizeMessageBuf - i, " (%s)", pc );
        i = TY_(tmbstrlen)(result->messageOutput);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutput + i, sizeMessageBuf - i, " (%s)", pc );
        i = 0;
    }

    result->allowMessage = yes;

    /* reportFilter is a simple error filter that provides minimal information
       to callback functions, and includes the message buffer in LibTidy's
       configured localization. As it's a "legacy" API, it does not receive
       TidyDialogue messages.*/
    if ( (result->level <= TidyFatal) && doc->reportFilter )
    {
        result->allowMessage = result->allowMessage & doc->reportFilter( tdoc, result->level, result->line, result->column, result->messageOutput );
    }

    /* reportCallback is intended to allow LibTidy users to localize messages
       via their own means by providing a key and the parameters to fill it. 
       As it's a "legacy" API, it does not receive TidyDialogue messages. */
    if ( (result->level <= TidyFatal) && doc->reportCallback )
    {
        TidyDoc tdoc = tidyImplToDoc( doc );
        va_copy(args_copy, args);
        result->allowMessage = result->allowMessage & doc->reportCallback( tdoc, result->level, result->line, result->column, result->messageKey, args_copy );
        va_end(args_copy);
    }

    /* messageCallback is the newest interface to interrogate Tidy's
       emitted messages. */
    if ( doc->messageCallback )
    {
        result->allowMessage = result->allowMessage & doc->messageCallback( tidyImplToMessage(result) );
    }

    return result;
}